

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

bool duckdb::Value::ValuesAreEqual
               (CastFunctionSet *set,GetCastFunctionInput *get_input,Value *result_value,
               Value *value)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  string *psVar6;
  Value *value_00;
  string local_f0;
  Value local_d0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar4 = result_value->is_null;
  while( true ) {
    value_00 = value;
    value = result_value;
    if (((bVar4 & 1) != 0) || (value_00->is_null != false)) {
      bVar4 = bVar4 ^ value_00->is_null ^ 1;
      goto LAB_002e046b;
    }
    LVar1 = (value_00->type_).id_;
    if (LVar1 == VARCHAR) break;
    if (LVar1 == DOUBLE) {
      LogicalType::LogicalType((LogicalType *)&local_f0,DOUBLE);
      CastAs(&local_d0,value,set,get_input,(LogicalType *)&local_f0,false);
      LogicalType::~LogicalType((LogicalType *)&local_f0);
      bVar4 = ApproxEqual((value_00->value_).double_,
                          (double)CONCAT44(local_d0.value_.interval.days,local_d0.value_.integer));
      goto LAB_002e0461;
    }
    if (LVar1 == FLOAT) {
      LogicalType::LogicalType((LogicalType *)&local_f0,FLOAT);
      CastAs(&local_d0,value,set,get_input,(LogicalType *)&local_f0,false);
      LogicalType::~LogicalType((LogicalType *)&local_f0);
      bVar4 = ApproxEqual((value_00->value_).float_,local_d0.value_.float_);
      goto LAB_002e0461;
    }
    bVar4 = 0;
    result_value = value_00;
    if (((value->type_).id_ & ~SQLNULL) != FLOAT) {
      bVar3 = ValueOperations::Equals(value_00,value);
      return bVar3;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_f0,VARCHAR);
  CastAs(&local_d0,value,set,get_input,(LogicalType *)&local_f0,false);
  LogicalType::~LogicalType((LogicalType *)&local_f0);
  psVar6 = StringValue::Get_abi_cxx11_(&local_d0);
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + psVar6->_M_string_length);
  SanitizeValue(&local_f0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  psVar6 = StringValue::Get_abi_cxx11_(value_00);
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + psVar6->_M_string_length);
  SanitizeValue(&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_f0._M_string_length == local_70._M_string_length) {
    if (local_f0._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar5 = bcmp(local_f0._M_dataplus._M_p,local_70._M_dataplus._M_p,local_f0._M_string_length);
      bVar4 = iVar5 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
LAB_002e0461:
  ~Value(&local_d0);
LAB_002e046b:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Value::ValuesAreEqual(CastFunctionSet &set, GetCastFunctionInput &get_input, const Value &result_value,
                           const Value &value) {
	if (result_value.IsNull() != value.IsNull()) {
		return false;
	}
	if (result_value.IsNull() && value.IsNull()) {
		// NULL = NULL in checking code
		return true;
	}
	switch (value.type_.id()) {
	case LogicalTypeId::FLOAT: {
		auto other = result_value.CastAs(set, get_input, LogicalType::FLOAT);
		float ldecimal = value.value_.float_;
		float rdecimal = other.value_.float_;
		return ApproxEqual(ldecimal, rdecimal);
	}
	case LogicalTypeId::DOUBLE: {
		auto other = result_value.CastAs(set, get_input, LogicalType::DOUBLE);
		double ldecimal = value.value_.double_;
		double rdecimal = other.value_.double_;
		return ApproxEqual(ldecimal, rdecimal);
	}
	case LogicalTypeId::VARCHAR: {
		auto other = result_value.CastAs(set, get_input, LogicalType::VARCHAR);
		string left = SanitizeValue(StringValue::Get(other));
		string right = SanitizeValue(StringValue::Get(value));
		return left == right;
	}
	default:
		if (result_value.type_.id() == LogicalTypeId::FLOAT || result_value.type_.id() == LogicalTypeId::DOUBLE) {
			return Value::ValuesAreEqual(set, get_input, value, result_value);
		}
		return value == result_value;
	}
}